

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

void fdump_attr_list(void *file,attr_list list)

{
  atom_server *asp;
  
  asp = (atom_server *)file;
  if (global_as_lock != (atl_lock_func)0x0) {
    asp = (atom_server *)global_as_lock_data;
    (*global_as_lock)(global_as_lock_data);
  }
  init_global_atom_server(asp);
  if (global_as_unlock != (atl_lock_func)0x0) {
    (*global_as_unlock)(global_as_lock_data);
  }
  fprintf((FILE *)file,"Attribute list %p, ref_count = %d\n",list,(ulong)(uint)(int)list->ref_count)
  ;
  internal_dump_attr_list((FILE *)file,list,0);
  return;
}

Assistant:

extern void
fdump_attr_list(void *file, attr_list list)
{
    FILE *out = (FILE*)file;
    atl_lock();
    init_global_atom_server(&global_as);
    atl_unlock();
    fprintf(out, "Attribute list %p, ref_count = %d\n", list, list->ref_count);
    internal_dump_attr_list(out, list, 0);
}